

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

ImportSourcePtr __thiscall
libcellml::Annotator::importSource(Annotator *this,string *id,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ImportSourcePtr IVar1;
  shared_ptr<libcellml::AnyCellmlElement> local_38;
  size_t index_local;
  string *id_local;
  Annotator *this_local;
  
  index_local = index;
  id_local = id;
  this_local = this;
  item((Annotator *)&local_38,id,index);
  std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_38);
  AnyCellmlElement::importSource((AnyCellmlElement *)this);
  std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr(&local_38);
  IVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr Annotator::importSource(const std::string &id, size_t index)
{
    return item(id, index)->importSource();
}